

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  Chunk CVar1;
  int iVar2;
  uint uVar3;
  Chunk *pCVar4;
  Bignum *in_RSI;
  Bignum *in_RDI;
  Chunk difference_1;
  Chunk difference;
  int i;
  Chunk borrow;
  int offset;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int index;
  uint local_18;
  
  Align((Bignum *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
        (Bignum *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar2 = (int)in_RSI->exponent_ - (int)in_RDI->exponent_;
  local_18 = 0;
  for (index = 0; index < in_RSI->used_bigits_; index = index + 1) {
    pCVar4 = RawBigit(in_RDI,index + iVar2);
    CVar1 = *pCVar4;
    pCVar4 = RawBigit(in_RSI,index);
    local_18 = (CVar1 - *pCVar4) - local_18;
    uVar3 = local_18 & 0xfffffff;
    pCVar4 = RawBigit(in_RDI,index + iVar2);
    *pCVar4 = uVar3;
    local_18 = local_18 >> 0x1f;
  }
  for (; local_18 != 0; local_18 = local_18 >> 0x1f) {
    pCVar4 = RawBigit(in_RDI,index + iVar2);
    local_18 = *pCVar4 - local_18;
    in_stack_ffffffffffffffc4 = local_18 & 0xfffffff;
    pCVar4 = RawBigit(in_RDI,index + iVar2);
    *pCVar4 = in_stack_ffffffffffffffc4;
    index = index + 1;
  }
  Clamp((Bignum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  DOUBLE_CONVERSION_ASSERT(LessEqual(other, *this));

  Align(other);

  const int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_bigits_; ++i) {
    DOUBLE_CONVERSION_ASSERT((borrow == 0) || (borrow == 1));
    const Chunk difference = RawBigit(i + offset) - other.RawBigit(i) - borrow;
    RawBigit(i + offset) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    const Chunk difference = RawBigit(i + offset) - borrow;
    RawBigit(i + offset) = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}